

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

MultiplyLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::MultiplyLayerParams>
          (Arena *arena)

{
  MultiplyLayerParams *pMVar1;
  
  if (arena != (Arena *)0x0) {
    pMVar1 = DoCreateMessage<CoreML::Specification::MultiplyLayerParams>(arena);
    return pMVar1;
  }
  pMVar1 = (MultiplyLayerParams *)operator_new(0x18);
  CoreML::Specification::MultiplyLayerParams::MultiplyLayerParams(pMVar1,(Arena *)0x0,false);
  return pMVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }